

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outArgs)

{
  pointer pcVar1;
  bool bVar2;
  cmListFileContext *pcVar3;
  pointer __x;
  cmListFileArgument *i;
  pointer pcVar4;
  string_view arg;
  string value;
  
  value._M_dataplus._M_p =
       (pointer)(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  value._M_string_length =
       (size_type)
       (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length)->_M_use_count +
           1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length)->_M_use_count +
           1;
    }
  }
  pcVar3 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                     ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&value);
  if (value._M_string_length != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length);
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(outArgs,((long)(inArgs->
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inArgs->
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  pcVar4 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pcVar4 == pcVar1) {
      bVar2 = true;
      if (cmSystemTools::s_FatalErrorOccurred == false) {
        bVar2 = cmSystemTools::GetInterruptFlag();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value._M_dataplus._M_p != &value.field_2) {
        operator_delete(value._M_dataplus._M_p,
                        CONCAT71(value.field_2._M_allocated_capacity._1_7_,
                                 value.field_2._M_local_buf[0]) + 1);
      }
      return (bool)(bVar2 ^ 1);
    }
    __x = pcVar4;
    if (pcVar4->Delim == Bracket) {
LAB_002ab489:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outArgs,&__x->Value);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&value);
      ExpandVariablesInString
                (this,&value,false,false,false,(pcVar3->FilePath)._M_dataplus._M_p,pcVar4->Line,
                 false,false);
      __x = (pointer)&value;
      if (pcVar4->Delim == Quoted) goto LAB_002ab489;
      arg._M_str = value._M_dataplus._M_p;
      arg._M_len = value._M_string_length;
      cmExpandList(arg,outArgs,false);
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

bool cmMakefile::ExpandArguments(std::vector<cmListFileArgument> const& inArgs,
                                 std::vector<std::string>& outArgs) const
{
  std::string const& filename = this->GetBacktrace().Top().FilePath;
  std::string value;
  outArgs.reserve(inArgs.size());
  for (cmListFileArgument const& i : inArgs) {
    // No expansion in a bracket argument.
    if (i.Delim == cmListFileArgument::Bracket) {
      outArgs.push_back(i.Value);
      continue;
    }
    // Expand the variables in the argument.
    value = i.Value;
    this->ExpandVariablesInString(value, false, false, false, filename.c_str(),
                                  i.Line, false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if (i.Delim == cmListFileArgument::Quoted) {
      outArgs.push_back(value);
    } else {
      cmExpandList(value, outArgs);
    }
  }
  return !cmSystemTools::GetFatalErrorOccurred();
}